

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Gia_Man_t * Jf_ManDeriveGia(Jf_Man_t *p)

{
  long lVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  word *pIn;
  bool bVar8;
  bool local_f9;
  word *local_98;
  word Truth [4];
  word **local_70;
  word *pTruth;
  word uTruth;
  int *piStack_58;
  int nWords;
  int *pCut;
  int Class;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Vec_Int_t *vCopies;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Jf_Man_t *p_local;
  
  pNew = (Gia_Man_t *)p;
  iVar3 = Gia_ManObjNum(p->pGia);
  vCover = Vec_IntStartFull(iVar3);
  vLeaves = Vec_IntAlloc(0x10000);
  _k = Vec_IntAlloc(0x10);
  uTruth._4_4_ = Abc_Truth6WordNum(*(int *)pNew->pSpec);
  pTruth = (word *)0x0;
  local_70 = &pTruth;
  iVar3 = Gia_ManObjNum((Gia_Man_t *)pNew->pName);
  pTemp = Gia_ManStart(iVar3);
  pcVar5 = Abc_UtilStrsav(*(char **)pNew->pName);
  pTemp->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(*(char **)(pNew->pName + 8));
  pTemp->pSpec = pcVar5;
  iVar3 = Gia_ManObjNum((Gia_Man_t *)pNew->pName);
  pVVar6 = Vec_IntStart((iVar3 * 6) / 5 + 100);
  pTemp->vLevels = pVVar6;
  Vec_IntWriteEntry(vCover,0,0);
  iLit = 0;
  while( true ) {
    iVar3 = iLit;
    iVar4 = Vec_IntSize(*(Vec_Int_t **)(pNew->pName + 0x40));
    bVar8 = false;
    if (iVar3 < iVar4) {
      vCopies = (Vec_Int_t *)Gia_ManCi((Gia_Man_t *)pNew->pName,iLit);
      bVar8 = vCopies != (Vec_Int_t *)0x0;
    }
    pVVar6 = vCover;
    if (!bVar8) break;
    iVar3 = Gia_ObjId((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies);
    iVar4 = Gia_ManAppendCi(pTemp);
    Vec_IntWriteEntry(pVVar6,iVar3,iVar4);
    iLit = iLit + 1;
  }
  if (*(int *)(pNew->pSpec + 0x58) == 0) {
    Gia_ObjComputeTruthTableStart((Gia_Man_t *)pNew->pName,*(int *)pNew->pSpec);
  }
  Gia_ManHashStart(pTemp);
  iLit = 0;
  do {
    bVar8 = false;
    if (iLit < *(int *)(pNew->pName + 0x18)) {
      vCopies = (Vec_Int_t *)Gia_ManObj((Gia_Man_t *)pNew->pName,iLit);
      bVar8 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar8) {
      iLit = 0;
      while( true ) {
        iVar3 = iLit;
        iVar4 = Vec_IntSize(*(Vec_Int_t **)(pNew->pName + 0x48));
        bVar8 = false;
        if (iVar3 < iVar4) {
          vCopies = (Vec_Int_t *)Gia_ManCo((Gia_Man_t *)pNew->pName,iLit);
          bVar8 = vCopies != (Vec_Int_t *)0x0;
        }
        pVVar6 = vCover;
        if (!bVar8) break;
        iVar3 = Gia_ObjFaninId0p((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies);
        iVar3 = Vec_IntEntry(pVVar6,iVar3);
        pGVar2 = pTemp;
        pCut._4_4_ = iVar3;
        iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
        iVar3 = Abc_LitNotCond(iVar3,iVar4);
        Gia_ManAppendCo(pGVar2,iVar3);
        iLit = iLit + 1;
      }
      if (*(int *)(pNew->pSpec + 0x58) == 0) {
        Gia_ObjComputeTruthTableStop((Gia_Man_t *)pNew->pName);
      }
      Vec_IntFree(vCover);
      Vec_IntFree(_k);
      Vec_IntFree(vLeaves);
      Gia_ManHashStop(pTemp);
      pGVar2 = pTemp;
      iVar3 = Gia_ManRegNum((Gia_Man_t *)pNew->pName);
      Gia_ManSetRegNum(pGVar2,iVar3);
      if (*(int *)(pNew->pSpec + 0x58) == 0) {
        pObj = (Gia_Obj_t *)pTemp;
        pTemp = Gia_ManCleanup(pTemp);
        Gia_ManStop((Gia_Man_t *)pObj);
      }
      return pTemp;
    }
    iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)vCopies);
    if (((iVar3 != 0) && (iVar3 = Gia_ObjIsBuf((Gia_Obj_t *)vCopies), iVar3 == 0)) &&
       (iVar3 = Gia_ObjRefNum((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies), iVar3 != 0)) {
      piStack_58 = Jf_ObjCutBest((Jf_Man_t *)pNew,iLit);
      if (*(int *)(pNew->pSpec + 0x58) == 0) {
        Vec_IntClear(_k);
        Class = 1;
        while( true ) {
          iVar3 = Class;
          iVar4 = Jf_CutSize(piStack_58);
          bVar8 = false;
          if (iVar3 <= iVar4) {
            pCut._4_4_ = Jf_CutLit(piStack_58,Class);
            bVar8 = pCut._4_4_ != 0;
          }
          pVVar6 = _k;
          if (!bVar8) break;
          iVar3 = Abc_Lit2Var(pCut._4_4_);
          Vec_IntPush(pVVar6,iVar3);
          Class = Class + 1;
        }
        local_70 = (word **)Gia_ObjComputeTruthTableCut
                                      ((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies,_k);
LAB_009826f9:
        Vec_IntClear(_k);
        Class = 1;
        while( true ) {
          iVar3 = Class;
          iVar4 = Jf_CutSize(piStack_58);
          bVar8 = false;
          if (iVar3 <= iVar4) {
            pCut._4_4_ = Jf_CutLit(piStack_58,Class);
            bVar8 = pCut._4_4_ != 0;
          }
          pVVar6 = _k;
          if (!bVar8) break;
          piVar7 = Vec_IntArray(vCover);
          iVar3 = Abc_Lit2LitL(piVar7,pCut._4_4_);
          Vec_IntPush(pVVar6,iVar3);
          Class = Class + 1;
        }
        iVar3 = Dsm_ManTruthToGia(pTemp,(word *)local_70,_k,vLeaves);
        local_f9 = false;
        pCut._4_4_ = iVar3;
        if (*(int *)(pNew->pSpec + 0x58) != 0) {
          iVar4 = Jf_CutFuncCompl(piStack_58);
          local_f9 = iVar4 != 0;
        }
        pCut._4_4_ = Abc_LitNotCond(iVar3,(uint)local_f9);
        Vec_IntWriteEntry(vCover,iLit,pCut._4_4_);
      }
      else {
        pCut._0_4_ = Jf_CutFuncClass(piStack_58);
        iVar4 = Jf_CutSize(piStack_58);
        pVVar6 = vCover;
        iVar3 = iLit;
        if (iVar4 == 0) {
          if ((int)pCut != 0) {
            __assert_fail("Class == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x64f,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
          }
          iVar4 = Jf_CutFunc(piStack_58);
          Vec_IntWriteEntry(pVVar6,iVar3,iVar4);
        }
        else {
          iVar3 = Jf_CutSize(piStack_58);
          if (iVar3 != 1) {
            if (*(int *)(pNew->pSpec + 0x5c) == 0) {
              local_70 = &local_98;
              pIn = Vec_MemReadEntry((Vec_Mem_t *)pNew->pObjs,(int)pCut);
              Abc_TtCopy((word *)local_70,pIn,uTruth._4_4_,0);
            }
            else {
              pTruth = (word *)Sdm_ManReadDsdTruth(*(Sdm_Man_t **)&pNew->nRegs,(int)pCut);
            }
            lVar1._0_4_ = pNew->nRegs;
            lVar1._4_4_ = pNew->nRegsAlloc;
            if (lVar1 != 0) {
              iVar3 = Sdm_ManReadDsdVarNum(*(Sdm_Man_t **)&pNew->nRegs,(int)pCut);
              iVar4 = Jf_CutSize(piStack_58);
              if (iVar3 != iVar4) {
                __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                              ,0x65f,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
              }
            }
            goto LAB_009826f9;
          }
          if ((int)pCut != 1) {
            __assert_fail("Class == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x655,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
          }
          iVar3 = Jf_CutLit(piStack_58,1);
          iVar4 = Jf_CutFuncCompl(piStack_58);
          pCut._4_4_ = Abc_LitNotCond(iVar3,iVar4);
          piVar7 = Vec_IntArray(vCover);
          pCut._4_4_ = Abc_Lit2LitL(piVar7,pCut._4_4_);
          Vec_IntWriteEntry(vCover,iLit,pCut._4_4_);
        }
      }
    }
    iLit = iLit + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Jf_ManDeriveGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, iLit, Class, * pCut;
    int nWords = Abc_Truth6WordNum(p->pPars->nLutSize);
    word uTruth = 0, * pTruth = &uTruth, Truth[JF_WORD_MAX];
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p->pGia)/5 + 100 );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStart( p->pGia, p->pPars->nLutSize );
    Gia_ManHashStart( pNew );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        // get the truth table
        if ( p->pPars->fCutMin )
        {
            Class = Jf_CutFuncClass( pCut );
            if ( Jf_CutSize(pCut) == 0 )
            {
                assert( Class == 0 );
                Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
                continue;
            }
            if ( Jf_CutSize(pCut) == 1 )
            {
                assert( Class == 1 );
                iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
                iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
                Vec_IntWriteEntry( vCopies, i, iLit );
                continue;
            }
            if ( p->pPars->fFuncDsd )
                uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
            else
                Abc_TtCopy( (pTruth = Truth), Vec_MemReadEntry(p->vTtMem, Class), nWords, 0 );
            assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        }
        else
        {
            Vec_IntClear( vLeaves );
            Jf_CutForEachLit( pCut, iLit, k )
                Vec_IntPush( vLeaves, Abc_Lit2Var(iLit) );
            pTruth = Gia_ObjComputeTruthTableCut( p->pGia, pObj, vLeaves );
        }
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
        iLit = Abc_LitNotCond( iLit, (p->pPars->fCutMin && Jf_CutFuncCompl(pCut)) );
        Vec_IntWriteEntry( vCopies, i, iLit );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStop( p->pGia );
    Vec_IntFree( vCopies );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
//    Dsm_ManReportStats();
    // perform cleanup
    if ( !p->pPars->fCutMin )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    return pNew;
}